

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

MemoryAccountantAllocationNode * __thiscall
MemoryAccountant::createNewAccountantAllocationNode
          (MemoryAccountant *this,size_t size,MemoryAccountantAllocationNode *next)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountantAllocationNode *in_RDX;
  size_t in_RSI;
  long in_RDI;
  MemoryAccountantAllocationNode *node;
  
  pMVar1 = (MemoryAccountantAllocationNode *)
           (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                     (*(long **)(in_RDI + 8),0x30,
                      "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O0/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
                      ,0x199);
  pMVar1->size_ = in_RSI;
  pMVar1->allocations_ = 0;
  pMVar1->deallocations_ = 0;
  pMVar1->maxAllocations_ = 0;
  pMVar1->currentAllocations_ = 0;
  pMVar1->next_ = in_RDX;
  return pMVar1;
}

Assistant:

MemoryAccountantAllocationNode* MemoryAccountant::createNewAccountantAllocationNode(size_t size, MemoryAccountantAllocationNode* next) const
{
    MemoryAccountantAllocationNode* node = (MemoryAccountantAllocationNode*) (void*) allocator_->alloc_memory(sizeof(MemoryAccountantAllocationNode), __FILE__, __LINE__);
    node->size_ = size;
    node->allocations_ = 0;
    node->deallocations_ = 0;
    node->maxAllocations_ = 0;
    node->currentAllocations_ = 0;
    node->next_ = next;
    return node;
}